

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Checkbox(char *label,bool *v)

{
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 p_max;
  ImVec2 p_min;
  bool bVar1;
  byte *in_RSI;
  ImVec2 label_pos;
  float pad_1;
  float pad;
  bool mixed_value;
  ImU32 check_col;
  ImRect check_bb;
  bool pressed;
  bool held;
  bool hovered;
  ImRect total_bb;
  ImVec2 pos;
  float square_sz;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  ImRect *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffeb0;
  ImRect *in_stack_fffffffffffffeb8;
  ImDrawList *pIVar2;
  ImGuiWindow *in_stack_fffffffffffffec0;
  ImVec2 *this;
  ImDrawList *in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffed0;
  float fVar3;
  undefined8 in_stack_fffffffffffffed8;
  ImGuiButtonFlags flags;
  ImVec2 *pIVar4;
  undefined1 hide_text_after_hash;
  bool *in_stack_fffffffffffffee0;
  bool *in_stack_fffffffffffffee8;
  ImVec2 *text;
  undefined8 in_stack_fffffffffffffef0;
  ImGuiID id_00;
  ImVec2 pos_02;
  ImRect *bb;
  float local_fc;
  ImVec2 in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  ImVec2 in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  ImGuiNavHighlightFlags in_stack_ffffffffffffff48;
  ImGuiID in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined1 local_a8 [8];
  ImVec2 local_a0;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImRect local_7c;
  byte local_6b;
  byte local_6a;
  byte local_69;
  ImRect local_68;
  ImRect local_58;
  ImVec2 local_48;
  float local_40;
  ImVec2 local_3c;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  ImGuiWindow *local_20;
  byte *local_18;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  flags = (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  local_18 = in_RSI;
  local_20 = GetCurrentWindow();
  if ((local_20->SkipItems & 1U) == 0) {
    local_28 = GImGui;
    local_30 = &GImGui->Style;
    local_34 = ImGuiWindow::GetID(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                                  in_stack_fffffffffffffeb0);
    local_3c = CalcTextSize((char *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                            SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffeb8,0));
    local_40 = GetFrameHeight();
    local_48 = (local_20->DC).CursorPos;
    if (local_3c.x <= 0.0) {
      local_fc = 0.0;
    }
    else {
      local_fc = (local_30->ItemInnerSpacing).x + local_3c.x;
    }
    fVar3 = (local_30->FramePadding).y;
    bb = &local_68;
    ImVec2::ImVec2(&bb->Min,local_40 + local_fc,fVar3 + fVar3 + local_3c.y);
    local_68.Max = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                             ,(ImVec2 *)0x19b7b7);
    ImRect::ImRect(&local_58,&local_48,&local_68.Max);
    ItemSize(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    bVar1 = ItemAdd((ImRect *)in_stack_fffffffffffffec8,
                    (ImGuiID)((ulong)in_stack_fffffffffffffec0 >> 0x20),in_stack_fffffffffffffeb8);
    if (bVar1) {
      local_6b = ButtonBehavior(bb,id_00,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,flags);
      if ((bool)local_6b) {
        *local_18 = (*local_18 ^ 0xff) & 1;
        MarkItemEdited(local_34);
      }
      pIVar4 = &local_8c;
      ImVec2::ImVec2(pIVar4,local_40,local_40);
      hide_text_after_hash = (undefined1)((ulong)pIVar4 >> 0x38);
      pIVar4 = &local_48;
      local_84 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (ImVec2 *)0x19b8b9);
      ImRect::ImRect(&local_7c,pIVar4,&local_84);
      RenderNavHighlight((ImRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      text = &local_7c.Max;
      pos_02 = (ImVec2)local_a8;
      ImVec2::ImVec2((ImVec2 *)pos_02,0.5,0.0);
      local_a0 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (ImVec2 *)0x19b93e);
      if (((local_6a & 1) == 0) || ((local_69 & 1) == 0)) {
        fVar3 = 9.80909e-45;
        if ((local_69 & 1) != 0) {
          fVar3 = 1.12104e-44;
        }
      }
      else {
        fVar3 = 1.26117e-44;
      }
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0));
      p_min.y = in_stack_ffffffffffffff44;
      p_min.x = in_stack_ffffffffffffff40;
      p_max.y = in_stack_ffffffffffffff3c;
      p_max.x = in_stack_ffffffffffffff38;
      RenderFrame(p_min,p_max,(ImU32)in_stack_ffffffffffffff30.y,in_stack_ffffffffffffff30.x._3_1_,
                  in_stack_ffffffffffffff2c);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                  SUB84(in_stack_fffffffffffffeb0,0));
      if (((local_20->DC).ItemFlags & 0x40U) == 0) {
        if ((*local_18 & 1) != 0) {
          pIVar2 = local_20->DrawList;
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff28,0.5,0.5);
          in_stack_ffffffffffffff30 =
               operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                         (ImVec2 *)0x19baf5);
          pos_01.y = fVar3;
          pos_01.x = in_stack_fffffffffffffed0;
          RenderCheckMark(in_stack_fffffffffffffec8,pos_01,
                          (ImU32)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                          SUB84(in_stack_fffffffffffffec0,0),(char *)pIVar2);
        }
      }
      else {
        pIVar2 = local_20->DrawList;
        this = (ImVec2 *)&stack0xffffffffffffff3c;
        ImVec2::ImVec2(this,0.5,0.5);
        operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                  (ImVec2 *)0x19ba52);
        pos_00.y = fVar3;
        pos_00.x = in_stack_fffffffffffffed0;
        RenderCheckMark(pIVar2,pos_00,(ImU32)((ulong)this >> 0x20),SUB84(this,0),
                        (char *)in_stack_fffffffffffffeb8);
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff20,
                     local_7c.Max.x + (local_30->ItemInnerSpacing).x,
                     local_7c.Min.y + (local_30->FramePadding).y);
      if ((local_28->LogEnabled & 1U) != 0) {
        LogRenderedText((ImVec2 *)in_stack_ffffffffffffff30,
                        (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                        (char *)in_stack_ffffffffffffff20);
      }
      if (0.0 < local_3c.x) {
        RenderText(pos_02,(char *)text,(char *)pIVar4,(bool)hide_text_after_hash);
      }
      local_1 = (bool)(local_6b & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::Checkbox(const char* label, bool* v)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const float square_sz = GetFrameHeight();
    const ImVec2 pos = window->DC.CursorPos;
    const ImRect total_bb(pos, pos + ImVec2(square_sz + (label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f), label_size.y + style.FramePadding.y * 2.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id))
    {
        IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Checkable | (*v ? ImGuiItemStatusFlags_Checked : 0));
        return false;
    }

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
    {
        *v = !(*v);
        MarkItemEdited(id);
    }

    const ImRect check_bb(pos, pos + ImVec2(square_sz, square_sz));
    RenderNavHighlight(total_bb, id);
    RenderFrame(check_bb.Min, check_bb.Max + ImVec2(0.5f, 0.0f), GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), true, style.FrameRounding);
    ImU32 check_col = GetColorU32(ImGuiCol_CheckMark);
    bool mixed_value = (window->DC.ItemFlags & ImGuiItemFlags_MixedValue) != 0;
    if (mixed_value)
    {
        // Undocumented tristate/mixed/indeterminate checkbox (#2644)
        // This may seem awkwardly designed because the aim is to make ImGuiItemFlags_MixedValue supported by all widgets (not just checkbox)
        //ImVec2 pad(ImMax(1.0f, IM_FLOOR(square_sz / 3.6f)), ImMax(1.0f, IM_FLOOR(square_sz / 3.6f)));
        //window->DrawList->AddRectFilled(check_bb.Min + pad, check_bb.Max - pad, check_col, style.FrameRounding);
        const float pad = 0.5f;
        RenderCheckMark(window->DrawList, check_bb.Min + ImVec2(pad, pad), check_col, square_sz - pad * 2.0f, "O");
    }
    else if (*v)
    {
        //const float pad = ImMax(1.0f, IM_FLOOR(square_sz / 6.0f));
        const float pad = 0.5f;
        RenderCheckMark(window->DrawList, check_bb.Min + ImVec2(pad, pad), check_col, square_sz - pad * 2.0f);
    }

    ImVec2 label_pos = ImVec2(check_bb.Max.x + style.ItemInnerSpacing.x, check_bb.Min.y + style.FramePadding.y);
    if (g.LogEnabled)
        LogRenderedText(&label_pos, mixed_value ? "[~]" : *v ? "[x]" : "[ ]");
    if (label_size.x > 0.0f)
        RenderText(label_pos, label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Checkable | (*v ? ImGuiItemStatusFlags_Checked : 0));
    return pressed;
}